

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lrzip.c
# Opt level: O1

int lrzip_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  int iVar2;
  long in_RAX;
  int *piVar3;
  ssize_t avail;
  long local_8;
  
  local_8 = in_RAX;
  piVar3 = (int *)__archive_read_filter_ahead(filter,6,&local_8);
  iVar1 = 0;
  iVar2 = 0;
  if ((((piVar3 != (int *)0x0) && (iVar2 = iVar1, local_8 != 0)) && (*piVar3 == 0x495a524c)) &&
     (((char)piVar3[1] == '\0' && (iVar2 = 6, (byte)(*(char *)((long)piVar3 + 5) - 0xbU) < 0xfb))))
  {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
lrzip_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *p;
	ssize_t avail, len;
	int i;

	(void)self; /* UNUSED */
	/* Start by looking at the first six bytes of the header, which
	 * is all fixed layout. */
	len = 6;
	p = __archive_read_filter_ahead(filter, len, &avail);
	if (p == NULL || avail == 0)
		return (0);

	if (memcmp(p, LRZIP_HEADER_MAGIC, LRZIP_HEADER_MAGIC_LEN))
		return (0);

	/* current major version is always 0, verify this */
	if (p[LRZIP_HEADER_MAGIC_LEN])
		return 0;
	/* support only v0.6+ lrzip for sanity */
	i = p[LRZIP_HEADER_MAGIC_LEN + 1];
	if ((i < 6) || (i > 10))
		return 0;

	return (int)len;
}